

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O3

bool __thiscall
S2MinDistanceCellUnionTarget::UpdateMinDistance
          (S2MinDistanceCellUnionTarget *this,S2Point *p,S2MinDistance *min_dist)

{
  S2ClosestCellQuery *pSVar1;
  Result r;
  Result local_70;
  Options local_58;
  Target local_30;
  VType local_28;
  VType VStack_20;
  VType local_18;
  
  local_18 = p->c_[2];
  local_28 = p->c_[0];
  VStack_20 = p->c_[1];
  local_30._vptr_S2DistanceTarget = (_func_int **)&PTR__S2DistanceTarget_002bb8b8;
  *(double *)
   &(((this->query_)._M_t.
      super___uniq_ptr_impl<S2ClosestCellQuery,_std::default_delete<S2ClosestCellQuery>_>._M_t.
      super__Tuple_impl<0UL,_S2ClosestCellQuery_*,_std::default_delete<S2ClosestCellQuery>_>.
      super__Head_base<0UL,_S2ClosestCellQuery_*,_false>._M_head_impl)->options_).super_Options =
       (min_dist->super_S1ChordAngle).length2_;
  pSVar1 = (this->query_)._M_t.
           super___uniq_ptr_impl<S2ClosestCellQuery,_std::default_delete<S2ClosestCellQuery>_>._M_t.
           super__Tuple_impl<0UL,_S2ClosestCellQuery_*,_std::default_delete<S2ClosestCellQuery>_>.
           super__Head_base<0UL,_S2ClosestCellQuery_*,_false>._M_head_impl;
  local_58.max_distance_.super_S1ChordAngle.length2_ =
       *(S1ChordAngle *)&(pSVar1->options_).super_Options;
  local_58.max_error_.length2_ = ((Delta *)((long)&(pSVar1->options_).super_Options + 8))->length2_;
  local_58.region_ = *(S2Region **)((long)&(pSVar1->options_).super_Options + 0x10);
  local_58._28_4_ =
       SUB84((ulong)*(undefined8 *)((long)&(pSVar1->options_).super_Options + 0x18) >> 0x20,0);
  local_58.max_results_ = 1;
  S2ClosestCellQueryBase<S2MinDistance>::FindClosestCell
            (&local_70,&pSVar1->base_,&local_30,&local_58);
  if (local_70.cell_id_.id_ != 0) {
    (min_dist->super_S1ChordAngle).length2_ = (double)local_70.distance_;
  }
  return local_70.cell_id_.id_ != 0;
}

Assistant:

bool S2MinDistanceCellUnionTarget::UpdateMinDistance(
    const S2Point& p, S2MinDistance* min_dist) {
  S2ClosestCellQuery::PointTarget target(p);
  return UpdateMinDistance(&target, min_dist);
}